

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabSync(sqlite3 *db,Vdbe *p)

{
  VTable **ppVVar1;
  sqlite3_vtab *pVtab_00;
  _func_int_sqlite3_vtab_ptr *p_Var2;
  bool bVar3;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *x;
  VTable **aVTrans;
  int rc;
  int i;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  aVTrans._0_4_ = 0;
  ppVVar1 = db->aVTrans;
  db->aVTrans = (VTable **)0x0;
  aVTrans._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if ((int)aVTrans == 0) {
      bVar3 = aVTrans._4_4_ < db->nVTrans;
    }
    if (!bVar3) break;
    pVtab_00 = ppVVar1[aVTrans._4_4_]->pVtab;
    if ((pVtab_00 != (sqlite3_vtab *)0x0) &&
       (p_Var2 = pVtab_00->pModule->xSync, p_Var2 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
      aVTrans._0_4_ = (*p_Var2)(pVtab_00);
      sqlite3VtabImportErrmsg(p,pVtab_00);
    }
    aVTrans._4_4_ = aVTrans._4_4_ + 1;
  }
  db->aVTrans = ppVVar1;
  return (int)aVTrans;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSync(sqlite3 *db, Vdbe *p){
  int i;
  int rc = SQLITE_OK;
  VTable **aVTrans = db->aVTrans;

  db->aVTrans = 0;
  for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
    int (*x)(sqlite3_vtab *);
    sqlite3_vtab *pVtab = aVTrans[i]->pVtab;
    if( pVtab && (x = pVtab->pModule->xSync)!=0 ){
      rc = x(pVtab);
      sqlite3VtabImportErrmsg(p, pVtab);
    }
  }
  db->aVTrans = aVTrans;
  return rc;
}